

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall nn::ESoinn::deleteNodes(ESoinn *this)

{
  double dVar1;
  ConcreteLogger *this_00;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  AbstractWeightVector *pAVar7;
  reference puVar8;
  double dVar9;
  double dVar10;
  uint local_88;
  uint32_t i_1;
  uint32_t num;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  undefined1 local_60 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> deleted_neurons;
  allocator local_31;
  string local_30;
  ESoinn *local_10;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"deleteNodes function",&local_31);
  logger::ConcreteLogger::debug(this_00,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  for (__range1._4_4_ = 0; uVar4 = (ulong)__range1._4_4_,
      sVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), uVar4 < sVar5; __range1._4_4_ = __range1._4_4_ + 1) {
    pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)__range1._4_4_);
    bVar2 = neuron::ESoinnNeuron::is_deleted(pvVar6);
    if (!bVar2) {
      pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)__range1._4_4_);
      uVar3 = neuron::ESoinnNeuron::getNumNeighbours(pvVar6);
      if (uVar3 == 0) {
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)__range1._4_4_);
        pAVar7 = neuron::AbstractNeuron::getWv(&pvVar6->super_AbstractNeuron);
        if (pAVar7 != (AbstractWeightVector *)0x0) {
          (*pAVar7->_vptr_AbstractWeightVector[7])();
        }
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)__range1._4_4_);
        neuron::ESoinnNeuron::setDeleted(pvVar6);
      }
      pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)__range1._4_4_);
      uVar3 = neuron::ESoinnNeuron::getNumNeighbours(pvVar6);
      if (uVar3 == 1) {
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)__range1._4_4_);
        dVar9 = neuron::ESoinnNeuron::density(pvVar6);
        dVar1 = this->m_C1;
        dVar10 = calcAvgDensity(this);
        if (dVar9 < dVar1 * dVar10) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                     (value_type_conflict3 *)((long)&__range1 + 4));
        }
      }
      else {
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)__range1._4_4_);
        uVar3 = neuron::ESoinnNeuron::getNumNeighbours(pvVar6);
        if (uVar3 == 2) {
          pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                   operator[](&this->m_Neurons,(ulong)__range1._4_4_);
          dVar9 = neuron::ESoinnNeuron::density(pvVar6);
          dVar1 = this->m_C2;
          dVar10 = calcAvgDensity(this);
          if (dVar9 < dVar1 * dVar10) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                       (value_type_conflict3 *)((long)&__range1 + 4));
          }
        }
      }
    }
  }
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  _i_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&i_1), bVar2) {
    puVar8 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    deleteNeuron(this,*puVar8);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  for (local_88 = 0;
      sVar5 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), local_88 < sVar5; local_88 = local_88 + 1) {
    pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_88);
    bVar2 = neuron::ESoinnNeuron::is_deleted(pvVar6);
    if (!bVar2) {
      pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)local_88);
      uVar3 = neuron::ESoinnNeuron::getNumNeighbours(pvVar6);
      if (uVar3 == 0) {
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)local_88);
        pAVar7 = neuron::AbstractNeuron::getWv(&pvVar6->super_AbstractNeuron);
        if (pAVar7 != (AbstractWeightVector *)0x0) {
          (*pAVar7->_vptr_AbstractWeightVector[7])();
        }
        pvVar6 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                 operator[](&this->m_Neurons,(ulong)local_88);
        neuron::ESoinnNeuron::setDeleted(pvVar6);
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  return;
}

Assistant:

void ESoinn::deleteNodes()
    {
        log_netw->debug("deleteNodes function");
        //list of neurons which we will delete
        std::vector<uint32_t> deleted_neurons;
        //double avg_density = calcAvgDensity();
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
            
            if (m_Neurons[i].getNumNeighbours() == 1)
            {
                if (m_Neurons[i].density() < m_C1 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }
            else if (m_Neurons[i].getNumNeighbours() == 2)
            {
                if (m_Neurons[i].density() < m_C2 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }            
        }
        //delete neurons from list
        for (uint32_t num: deleted_neurons)
            deleteNeuron(num);    

        //delete neurons without neighbours (it may appeared after deletion other neurons)
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
        }
    }